

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_decoder_model_info(aom_dec_model_info_t *decoder_model_info,aom_write_bit_buffer *wb)

{
  aom_write_bit_buffer *in_RSI;
  int in_stack_ffffffffffffffe8;
  uint32_t in_stack_ffffffffffffffec;
  
  aom_wb_write_literal(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  aom_wb_write_unsigned_literal(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  aom_wb_write_literal(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  aom_wb_write_literal(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static inline void write_decoder_model_info(
    const aom_dec_model_info_t *const decoder_model_info,
    struct aom_write_bit_buffer *wb) {
  aom_wb_write_literal(
      wb, decoder_model_info->encoder_decoder_buffer_delay_length - 1, 5);
  aom_wb_write_unsigned_literal(
      wb, decoder_model_info->num_units_in_decoding_tick, 32);
  aom_wb_write_literal(wb, decoder_model_info->buffer_removal_time_length - 1,
                       5);
  aom_wb_write_literal(
      wb, decoder_model_info->frame_presentation_time_length - 1, 5);
}